

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger number_delegate_tochar(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQChar c;
  SQChar local_19;
  SQObjectPtr local_18;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  if ((pSVar2->super_SQObject)._type == OT_FLOAT) {
    local_19 = (SQChar)(long)(pSVar2->super_SQObject)._unVal.fFloat;
  }
  else {
    local_19 = (SQChar)*(undefined4 *)&(pSVar2->super_SQObject)._unVal;
  }
  local_18.super_SQObject._unVal.pString = SQString::Create(v->_sharedstate,&local_19,1);
  local_18.super_SQObject._type = OT_STRING;
  if (local_18.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    return 1;
  }
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                ,0xea,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

static SQInteger number_delegate_tochar(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQChar c = (SQChar)tointeger(o);
    v->Push(SQString::Create(_ss(v),(const SQChar *)&c,1));
    return 1;
}